

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LPO.cpp
# Opt level: O1

Result __thiscall Kernel::LPO::comparePredicates(LPO *this,Literal *l1,Literal *l2)

{
  uint uVar1;
  Result RVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  
  uVar1 = (l1->super_Term)._functor;
  uVar5 = (l2->super_Term)._functor;
  if (uVar1 == uVar5) {
    RVar2 = EQUAL;
    uVar1 = *(uint *)&(l1->super_Term).field_0xc & 0xfffffff;
    if (uVar1 != 0) {
      lVar6 = 0;
      uVar5 = 0;
      do {
        RVar2 = (*(this->super_PrecedenceOrdering).super_Ordering._vptr_Ordering[3])
                          (this,(l1->super_Term)._args[(ulong)uVar1 + lVar6]._content,
                           (l2->super_Term)._args
                           [(ulong)(*(uint *)&(l2->super_Term).field_0xc & 0xfffffff) + lVar6].
                           _content);
        if (RVar2 != EQUAL) {
          return RVar2;
        }
        uVar5 = uVar5 + 1;
        uVar1 = *(uint *)&(l1->super_Term).field_0xc & 0xfffffff;
        lVar6 = lVar6 + -1;
      } while (uVar5 < uVar1);
      RVar2 = EQUAL;
    }
  }
  else {
    iVar3 = PrecedenceOrdering::predicatePrecedence(&this->super_PrecedenceOrdering,uVar1);
    iVar4 = PrecedenceOrdering::predicatePrecedence(&this->super_PrecedenceOrdering,uVar5);
    RVar2 = (iVar3 <= iVar4) + GREATER;
  }
  return RVar2;
}

Assistant:

Ordering::Result LPO::comparePredicates(Literal* l1, Literal *l2) const
{
  ASS(l1->shared());
  ASS(l2->shared());
  ASS(!l1->isEquality());
  ASS(!l2->isEquality());

  unsigned p1 = l1->functor();
  unsigned p2 = l2->functor();

  if (p1 == p2) {
    ASS_EQ(l1->isNegative(), l1->isNegative()) // this assertion is meaningless. 
    //maybe:  ASS_EQ(l1->isNegative(), l2->isNegative())

    // compare arguments in lexicographic order
    for (unsigned i = 0; i < l1->arity(); i++) {
      Result res = compare(*l1->nthArgument(i), *l2->nthArgument(i));
      if (res != EQUAL)
        return res;
    }
    return EQUAL;
  }

  ASS_NEQ(predicatePrecedence(p1), predicatePrecedence(p2)); // precedence should be total
  return (predicatePrecedence(p1) > predicatePrecedence(p2)) ? GREATER : LESS;
}